

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format_mnist.hpp
# Opt level: O3

void pico_tree::read_mnist_images
               (string *filename,
               vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
               *images)

{
  runtime_error *prVar1;
  header header;
  big_endian<int> magic_number;
  fstream stream;
  uint local_230;
  uint local_22c;
  uint local_228;
  int local_224;
  string local_220 [16];
  
  internal::open_stream(local_220,(openmode)filename);
  ::std::istream::read((char *)local_220,(long)&local_224);
  if (local_224 != 0x3080000) {
    prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar1,"expected mnist images signature");
    __cxa_throw(prVar1,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::istream::read((char *)local_220,(long)&local_230);
  local_230 = local_230 >> 0x18 | (local_230 & 0xff0000) >> 8 | (local_230 & 0xff00) << 8 |
              local_230 << 0x18;
  local_22c = local_22c >> 0x18 | (local_22c & 0xff0000) >> 8 | (local_22c & 0xff00) << 8 |
              local_22c << 0x18;
  local_228 = local_228 >> 0x18 | (local_228 & 0xff0000) >> 8 | (local_228 & 0xff00) << 8 |
              local_228 << 0x18;
  if (local_228 * local_22c == 0x310) {
    std::vector<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>::
    resize(images,(long)(int)local_230);
    ::std::istream::read
              ((char *)local_220,
               (long)(images->
                     super__Vector_base<std::array<std::byte,_784UL>,_std::allocator<std::array<std::byte,_784UL>_>_>
                     )._M_impl.super__Vector_impl_data._M_start);
    ::std::fstream::~fstream(local_220);
    return;
  }
  prVar1 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(prVar1,"unexpected mnist image dimensions");
  __cxa_throw(prVar1,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

inline void read_mnist_images(
    std::string const& filename,
    std::vector<std::array<std::byte, 28 * 28>>& images) {
  using namespace internal;

  std::fstream stream = open_stream(filename, std::ios::in | std::ios::binary);
  stream_wrapper wrapper(stream);

  big_endian<std::int32_t> magic_number;
  wrapper.read(magic_number);
  if (magic_number() != mnist_images::header::magic_number) {
    throw std::runtime_error("expected mnist images signature");
  }

  mnist_images::header header;
  wrapper.read(header);
  header.image_count = big_endian<std::int32_t>{header.image_count};
  header.image_width = big_endian<std::int32_t>{header.image_width};
  header.image_height = big_endian<std::int32_t>{header.image_height};

  if (header.image_width * header.image_height != 28 * 28) {
    throw std::runtime_error("unexpected mnist image dimensions");
  }

  images.resize(static_cast<std::size_t>(header.image_count));
  wrapper.read(images.size(), images.data());
}